

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_decay(tsdn_t *tsdn,arena_t *arena,_Bool is_background_thread,_Bool all)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  ssize_t sVar4;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,all) != 0) {
    duckdb_je_sec_flush(tsdn,&(arena->pa_shard).hpa_sec);
  }
  _Var1 = arena_decay_impl(tsdn,arena,&(arena->pa_shard).pac.decay_dirty,
                           &((arena->pa_shard).pac.stats)->decay_dirty,
                           &(arena->pa_shard).pac.ecache_dirty,is_background_thread,all);
  if (!_Var1) {
    sVar2 = duckdb_je_eset_npages_get(&(arena->pa_shard).pac.ecache_muzzy.eset);
    sVar3 = duckdb_je_eset_npages_get(&(arena->pa_shard).pac.ecache_muzzy.guarded_eset);
    if ((sVar3 + sVar2 == 0) &&
       (sVar4 = duckdb_je_pac_decay_ms_get(&(arena->pa_shard).pac,extent_state_muzzy), sVar4 < 1)) {
      return;
    }
    arena_decay_impl(tsdn,arena,&(arena->pa_shard).pac.decay_muzzy,
                     &((arena->pa_shard).pac.stats)->decay_muzzy,&(arena->pa_shard).pac.ecache_muzzy
                     ,is_background_thread,all);
  }
  return;
}

Assistant:

void
arena_decay(tsdn_t *tsdn, arena_t *arena, bool is_background_thread, bool all) {
	if (all) {
		/*
		 * We should take a purge of "all" to mean "save as much memory
		 * as possible", including flushing any caches (for situations
		 * like thread death, or manual purge calls).
		 */
		sec_flush(tsdn, &arena->pa_shard.hpa_sec);
	}
	if (arena_decay_dirty(tsdn, arena, is_background_thread, all)) {
		return;
	}
	arena_decay_muzzy(tsdn, arena, is_background_thread, all);
}